

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_dirname(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  undefined8 in_RAX;
  long lVar2;
  uint nLen;
  char *zString;
  uint uVar3;
  char *pcVar4;
  jx9_value *pVal;
  long lVar5;
  int iLen;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pVal = pCtx->pRet;
    zString = "";
    nLen = 0;
  }
  else {
    zString = jx9_value_to_string(*apArg,&local_14);
    lVar2 = (long)local_14;
    if (lVar2 < 1) {
      pVal = pCtx->pRet;
      zString = ".";
      nLen = 1;
    }
    else {
      lVar1 = 1;
      pcVar4 = zString;
      do {
        lVar5 = lVar1;
        pcVar4 = pcVar4 + -1;
        if (pcVar4 + lVar2 <= zString) break;
        lVar1 = lVar5 + 1;
      } while (pcVar4[lVar2] != '/');
      if ((lVar2 - lVar5 == 0) && (pcVar4[lVar2] != '/')) {
        zString = ".";
        nLen = 1;
      }
      else {
        uVar3 = (uint)(lVar2 - lVar5);
        nLen = 1;
        if (1 < uVar3) {
          nLen = uVar3;
        }
        if (local_14 == (int)lVar5) {
          zString = "/";
        }
      }
      pVal = pCtx->pRet;
    }
  }
  jx9_value_string(pVal,zString,nLen);
  return 0;
}

Assistant:

static int jx9Builtin_dirname(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath, *zDir;
	int iLen, iDirlen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to the target path */
	zPath = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Reuturn "." */
		jx9_result_string(pCtx, ".", sizeof(char));
		return JX9_OK;
	}
	/* Perform the requested operation */
	zDir = jx9ExtractDirName(zPath, iLen, &iDirlen);
	/* Return directory name */
	jx9_result_string(pCtx, zDir, iDirlen);
	return JX9_OK;
}